

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDAComputeYp(void *ida_mem,N_Vector ycor,N_Vector yp)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x67a,"IDAComputeYp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x2b8),
                 *(undefined8 *)((long)ida_mem + 0x1a0));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAComputeYp(void* ida_mem, N_Vector ycor, N_Vector yp)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  N_VLinearSum(ONE, IDA_mem->ida_yppredict, IDA_mem->ida_cj, ycor, yp);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}